

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O3

void __thiscall
DenseHashMapMoveTest_CBeginCEnd_Test::TestBody(DenseHashMapMoveTest_CBeginCEnd_Test *this)

{
  uint uVar1;
  value_type *pvVar2;
  long lVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  char *message;
  char *in_R9;
  undefined7 uVar8;
  bool bVar9;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  AssertHelper local_a0;
  Message local_98;
  undefined8 *local_90;
  string local_88;
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_68;
  
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_
       = false;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  local_68.key_info.delkey = 0;
  local_68.key_info.empty_key = 0;
  local_68.num_deleted = 0;
  local_68.num_elements = 0;
  local_68.num_buckets = 0x20;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = 0x10;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = 6;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       true;
  local_68.table = (pointer)calloc(1,0x100);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::squash_deleted(&local_68);
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_
       = true;
  local_68.key_info.delkey = 0xffffffff;
  local_88._M_dataplus._M_p._0_4_ = 1;
  pvVar2 = google::
           dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::find_or_insert<int,int>
                     ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)&local_68,(int *)&local_88);
  pvVar2->second = 1;
  ppVar7 = local_68.table + local_68.num_buckets;
  ppVar5 = local_68.table;
  if (local_68.num_buckets != 0) {
    lVar3 = local_68.num_buckets << 3;
    ppVar4 = local_68.table;
    do {
      uVar1 = ppVar4->first;
      in_R9 = (char *)(ulong)uVar1;
      if ((local_68.key_info.empty_key != uVar1) &&
         (ppVar5 = ppVar4, local_68.num_deleted == 0 || local_68.key_info.delkey != uVar1)) break;
      ppVar4 = ppVar4 + 1;
      lVar3 = lVar3 + -8;
      ppVar5 = ppVar7;
    } while (lVar3 != 0);
  }
  local_98.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_88,"1","it->first",(int *)&local_98,&ppVar5->first);
  if ((char)local_88._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_98);
    if ((undefined8 *)local_88._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_88._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
               ,0x1d0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((long *)CONCAT44(local_98.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_98.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_98.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_98.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  else {
    if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_88._M_string_length !=
          (undefined8 *)(local_88._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_88._M_string_length);
      }
      operator_delete((void *)local_88._M_string_length);
    }
    do {
      ppVar5 = ppVar5 + 1;
      ppVar4 = ppVar7;
      if (ppVar5 == ppVar7) break;
    } while ((local_68.key_info.empty_key == ppVar5->first) ||
            (ppVar4 = ppVar5, local_68.num_deleted != 0 && local_68.key_info.delkey == ppVar5->first
            ));
    local_98.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_98.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,ppVar4 == local_68.table + local_68.num_buckets);
    local_90 = (undefined8 *)0x0;
    if (ppVar4 == local_68.table + local_68.num_buckets) {
      ppVar7 = local_68.table;
      if (local_68.num_buckets == 0) goto LAB_00a47b25;
      do {
        bVar9 = local_68.num_deleted != 0;
        uVar8 = (undefined7)((ulong)in_R9 >> 8);
        in_R9 = (char *)CONCAT71(uVar8,bVar9);
        uVar1 = ppVar7->first;
        if ((local_68.key_info.empty_key != uVar1) &&
           (in_R9 = (char *)CONCAT71(uVar8,bVar9 && local_68.key_info.delkey == uVar1),
           ppVar5 = ppVar7, !bVar9 || local_68.key_info.delkey != uVar1)) break;
        ppVar7 = ppVar7 + 1;
        ppVar5 = ppVar4;
      } while (ppVar7 != ppVar4);
      ppVar7 = local_68.table;
      ppVar6 = local_68.table;
      if (local_68.num_buckets != 0) {
        do {
          uVar1 = ppVar6->first;
          in_R9 = (char *)CONCAT71((int7)((ulong)in_R9 >> 8),local_68.key_info.delkey == uVar1);
          if ((local_68.key_info.empty_key != uVar1) &&
             (ppVar7 = ppVar6, local_68.num_deleted == 0 || local_68.key_info.delkey != uVar1))
          break;
          ppVar6 = ppVar6 + 1;
          ppVar7 = ppVar4;
        } while (ppVar6 != ppVar4);
      }
      local_98.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_98.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,ppVar5 == ppVar7);
      local_90 = (undefined8 *)0x0;
      if (ppVar5 == ppVar7) goto LAB_00a47b25;
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_88,(internal *)&local_98,(AssertionResult *)"begin == h.cbegin()","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                 ,0x1d8,(char *)CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                         local_88._M_dataplus._M_p._0_4_));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    }
    else {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_88,(internal *)&local_98,(AssertionResult *)"it == h.cend()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                 ,0x1d3,(char *)CONCAT44(local_88._M_dataplus._M_p._4_4_,
                                         local_88._M_dataplus._M_p._0_4_));
      testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_88._M_dataplus._M_p._4_4_,local_88._M_dataplus._M_p._0_4_));
    }
    local_88._M_string_length = (size_type)local_90;
    if (local_a8._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a8._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
      local_88._M_string_length = (size_type)local_90;
    }
  }
  if ((undefined8 *)local_88._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_88._M_string_length !=
        (undefined8 *)(local_88._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_88._M_string_length);
    }
    operator_delete((void *)local_88._M_string_length);
  }
LAB_00a47b25:
  if (local_68.table != (pointer)0x0) {
    free(local_68.table);
  }
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, CBeginCEnd)
{
    dense_hash_map<int, int> h;
    h.set_empty_key(0);
    h.set_deleted_key(-1);

    h[1] = 1;

    auto it = h.cbegin();
    ASSERT_EQ(1, it->first);

    std::advance(it, 1);
    ASSERT_TRUE(it == h.cend());

    using cit = dense_hash_map<int, int>::const_iterator;
    cit begin = h.begin();
    cit end = h.end();
    ASSERT_TRUE(begin == h.cbegin());
    ASSERT_TRUE(end == h.cend());
}